

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operator_node.cpp
# Opt level: O2

void __thiscall
OperatorNode::Act(OperatorNode *this,stack<double,_std::deque<double,_std::allocator<double>_>_> *s)

{
  uint uVar1;
  int i;
  uint uVar2;
  _Elt_pointer pdVar3;
  double res;
  _Vector_base<double,_std::allocator<double>_> local_48;
  value_type_conflict1 local_30;
  
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar2 = 0;
  while( true ) {
    uVar1 = (*this->operation_->_vptr_IOperation[2])();
    if (uVar1 <= uVar2) break;
    pdVar3 = (s->c).super__Deque_base<double,_std::allocator<double>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (pdVar3 == (s->c).super__Deque_base<double,_std::allocator<double>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_first) {
      pdVar3 = (s->c).super__Deque_base<double,_std::allocator<double>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)&local_48,pdVar3 + -1);
    std::deque<double,_std::allocator<double>_>::pop_back(&s->c);
    uVar2 = uVar2 + 1;
  }
  (*this->operation_->_vptr_IOperation[1])(this->operation_,&local_48);
  std::deque<double,_std::allocator<double>_>::push_back(&s->c,&local_30);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void OperatorNode::Act(std::stack<double> &s) const {
  std::vector<double> args{};
  for (int i = 0; i < operation_->GetArity(); i++) {
    // TODO: check stack. If it's empty - throw exception.
    args.push_back(s.top());
    s.pop();
  }
  auto res = operation_->Apply(args);
  s.push(res);
}